

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcprepct.c
# Opt level: O3

void pre_process_data(j_compress_ptr cinfo,JSAMPARRAY input_buf,JDIMENSION *in_row_ctr,
                     JDIMENSION in_rows_avail,JSAMPIMAGE output_buf,JDIMENSION *out_row_group_ctr,
                     JDIMENSION out_row_groups_avail)

{
  jpeg_c_prep_controller *pjVar1;
  JDIMENSION JVar2;
  int iVar3;
  jpeg_c_prep_controller *pjVar4;
  JSAMPARRAY ppJVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  jpeg_component_info *pjVar10;
  int row;
  int iVar11;
  int row_1;
  long lVar12;
  
  uVar6 = *in_row_ctr;
  if (uVar6 < in_rows_avail) {
    pjVar4 = cinfo->prep;
    do {
      if (out_row_groups_avail <= *out_row_group_ctr) {
        return;
      }
      JVar2 = *(JDIMENSION *)((long)&pjVar4[6].start_pass + 4);
      uVar9 = cinfo->max_v_samp_factor - JVar2;
      if (in_rows_avail - uVar6 <= uVar9) {
        uVar9 = in_rows_avail - uVar6;
      }
      (*cinfo->cconvert->color_convert)
                (cinfo,input_buf + uVar6,(JSAMPIMAGE)(pjVar4 + 1),JVar2,uVar9);
      *in_row_ctr = *in_row_ctr + uVar9;
      iVar7 = *(int *)((long)&pjVar4[6].start_pass + 4) + uVar9;
      *(int *)((long)&pjVar4[6].start_pass + 4) = iVar7;
      pjVar1 = pjVar4 + 6;
      *(uint *)&pjVar1->start_pass = *(int *)&pjVar1->start_pass - uVar9;
      iVar8 = cinfo->max_v_samp_factor;
      if (iVar7 < iVar8 && *(int *)&pjVar1->start_pass == 0) {
        iVar7 = cinfo->num_components;
        if (0 < iVar7) {
          lVar12 = 0;
          do {
            iVar8 = cinfo->max_v_samp_factor;
            iVar11 = *(int *)((long)&pjVar4[6].start_pass + 4);
            if (iVar11 < iVar8) {
              ppJVar5 = (JSAMPARRAY)(&pjVar4[1].start_pass)[lVar12];
              JVar2 = cinfo->image_width;
              iVar7 = iVar11 + -1;
              do {
                jcopy_sample_rows(ppJVar5,iVar7,ppJVar5,iVar11,1,JVar2);
                iVar11 = iVar11 + 1;
              } while (iVar8 != iVar11);
              iVar7 = cinfo->num_components;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < iVar7);
          iVar8 = cinfo->max_v_samp_factor;
        }
        *(int *)((long)&pjVar4[6].start_pass + 4) = iVar8;
LAB_0010f7dd:
        (*cinfo->downsample->downsample)
                  (cinfo,(JSAMPIMAGE)(pjVar4 + 1),0,output_buf,*out_row_group_ctr);
        *(undefined4 *)((long)&pjVar4[6].start_pass + 4) = 0;
        *out_row_group_ctr = *out_row_group_ctr + 1;
      }
      else if (iVar7 == iVar8) goto LAB_0010f7dd;
      if ((*(int *)&pjVar4[6].start_pass == 0) && (*out_row_group_ctr < out_row_groups_avail)) {
        iVar8 = cinfo->num_components;
        if (0 < iVar8) {
          pjVar10 = cinfo->comp_info;
          lVar12 = 0;
          do {
            iVar7 = (pjVar10->DCT_v_scaled_size * pjVar10->v_samp_factor) /
                    cinfo->min_DCT_v_scaled_size;
            iVar11 = *out_row_group_ctr * iVar7;
            if (iVar11 < (int)(iVar7 * out_row_groups_avail)) {
              iVar3 = pjVar10->DCT_h_scaled_size;
              ppJVar5 = output_buf[lVar12];
              JVar2 = pjVar10->width_in_blocks;
              iVar8 = iVar11 + -1;
              iVar7 = iVar7 * (out_row_groups_avail - *out_row_group_ctr);
              do {
                jcopy_sample_rows(ppJVar5,iVar8,ppJVar5,iVar11,1,iVar3 * JVar2);
                iVar11 = iVar11 + 1;
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
              iVar8 = cinfo->num_components;
            }
            lVar12 = lVar12 + 1;
            pjVar10 = pjVar10 + 1;
          } while (lVar12 < iVar8);
        }
        *out_row_group_ctr = out_row_groups_avail;
        return;
      }
      uVar6 = *in_row_ctr;
    } while (uVar6 < in_rows_avail);
  }
  return;
}

Assistant:

METHODDEF(void)
pre_process_data (j_compress_ptr cinfo,
		  JSAMPARRAY input_buf, JDIMENSION *in_row_ctr,
		  JDIMENSION in_rows_avail,
		  JSAMPIMAGE output_buf, JDIMENSION *out_row_group_ctr,
		  JDIMENSION out_row_groups_avail)
{
  my_prep_ptr prep = (my_prep_ptr) cinfo->prep;
  int numrows, ci;
  JDIMENSION inrows;
  jpeg_component_info * compptr;

  while (*in_row_ctr < in_rows_avail &&
	 *out_row_group_ctr < out_row_groups_avail) {
    /* Do color conversion to fill the conversion buffer. */
    inrows = in_rows_avail - *in_row_ctr;
    numrows = cinfo->max_v_samp_factor - prep->next_buf_row;
    numrows = (int) MIN((JDIMENSION) numrows, inrows);
    (*cinfo->cconvert->color_convert) (cinfo, input_buf + *in_row_ctr,
				       prep->color_buf,
				       (JDIMENSION) prep->next_buf_row,
				       numrows);
    *in_row_ctr += numrows;
    prep->next_buf_row += numrows;
    prep->rows_to_go -= numrows;
    /* If at bottom of image, pad to fill the conversion buffer. */
    if (prep->rows_to_go == 0 &&
	prep->next_buf_row < cinfo->max_v_samp_factor) {
      for (ci = 0; ci < cinfo->num_components; ci++) {
	expand_bottom_edge(prep->color_buf[ci], cinfo->image_width,
			   prep->next_buf_row, cinfo->max_v_samp_factor);
      }
      prep->next_buf_row = cinfo->max_v_samp_factor;
    }
    /* If we've filled the conversion buffer, empty it. */
    if (prep->next_buf_row == cinfo->max_v_samp_factor) {
      (*cinfo->downsample->downsample) (cinfo,
					prep->color_buf, (JDIMENSION) 0,
					output_buf, *out_row_group_ctr);
      prep->next_buf_row = 0;
      (*out_row_group_ctr)++;
    }
    /* If at bottom of image, pad the output to a full iMCU height.
     * Note we assume the caller is providing a one-iMCU-height output buffer!
     */
    if (prep->rows_to_go == 0 &&
	*out_row_group_ctr < out_row_groups_avail) {
      for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
	   ci++, compptr++) {
	numrows = (compptr->v_samp_factor * compptr->DCT_v_scaled_size) /
		  cinfo->min_DCT_v_scaled_size;
	expand_bottom_edge(output_buf[ci],
			   compptr->width_in_blocks * compptr->DCT_h_scaled_size,
			   (int) (*out_row_group_ctr * numrows),
			   (int) (out_row_groups_avail * numrows));
      }
      *out_row_group_ctr = out_row_groups_avail;
      break;			/* can exit outer loop without test */
    }
  }
}